

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Packer.h
# Opt level: O1

Ptr<axl::mem::Block> __thiscall axl::sl::Packer::createPackage_va(Packer *this,axl_va_list *va)

{
  EVP_PKEY_CTX *pEVar1;
  undefined4 *in_RDX;
  RefCount *extraout_RDX;
  RefCount *extraout_RDX_00;
  RefCount *pRVar2;
  Ptr<axl::mem::Block> PVar3;
  size_t size;
  Ptr<axl::rc::Box<axl::mem::Block>_> package;
  size_t local_c0;
  Ptr<axl::rc::Box<axl::mem::Block>_> local_b8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  char local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined8 local_78;
  char local_70;
  undefined1 local_60 [24];
  char local_48;
  undefined1 local_40 [24];
  char local_28;
  
  local_c0 = 0;
  local_88 = *in_RDX;
  uStack_84 = in_RDX[1];
  uStack_80 = in_RDX[2];
  uStack_7c = in_RDX[3];
  local_78 = *(undefined8 *)(in_RDX + 4);
  local_70 = '\x01';
  (*(code *)**(undefined8 **)va)(local_40,va,0);
  if (local_28 == '\x01') {
    local_28 = '\0';
  }
  if (local_70 == '\x01') {
    local_70 = '\0';
  }
  if (local_c0 == 0xffffffffffffffff) {
    this->_vptr_Packer = (_func_int **)0x0;
    this[1]._vptr_Packer = (_func_int **)0x0;
    pRVar2 = extraout_RDX;
  }
  else {
    pEVar1 = (EVP_PKEY_CTX *)operator_new(local_c0 + 0x28,(nothrow_t *)&std::nothrow);
    *(undefined4 *)(pEVar1 + 0x10) = 0;
    *(undefined4 *)(pEVar1 + 0x14) = 1;
    *(undefined8 *)(pEVar1 + 0x18) = 0;
    *(undefined8 *)(pEVar1 + 0x20) = 0;
    *(undefined ***)pEVar1 = &PTR__RefCount_0014c3e8;
    *(code **)(pEVar1 + 8) = mem::deallocate;
    local_b8.m_p = (Box<axl::mem::Block> *)0x0;
    local_b8.m_refCount = (RefCount *)0x0;
    rc::Ptr<axl::rc::Box<axl::mem::Block>_>::copy(&local_b8,pEVar1,pEVar1);
    local_a8 = *in_RDX;
    uStack_a4 = in_RDX[1];
    uStack_a0 = in_RDX[2];
    uStack_9c = in_RDX[3];
    local_98 = *(undefined8 *)(in_RDX + 4);
    local_90 = '\x01';
    (*(code *)**(undefined8 **)va)(local_60,va,local_b8.m_p + 1,&local_c0);
    if (local_48 == '\x01') {
      local_48 = '\0';
    }
    if (local_90 == '\x01') {
      local_90 = '\0';
    }
    pEVar1 = (EVP_PKEY_CTX *)&(local_b8.m_p)->super_Block;
    ((local_b8.m_p)->super_Block).m_p = local_b8.m_p + 1;
    ((local_b8.m_p)->super_Block).m_size = local_c0;
    this->_vptr_Packer = (_func_int **)0x0;
    this[1]._vptr_Packer = (_func_int **)0x0;
    if (local_b8.m_p == (Box<axl::mem::Block> *)0x0) {
      pEVar1 = (EVP_PKEY_CTX *)0x0;
    }
    rc::Ptr<axl::mem::Block>::copy
              ((Ptr<axl::mem::Block> *)this,pEVar1,(EVP_PKEY_CTX *)local_b8.m_refCount);
    rc::Ptr<axl::rc::Box<axl::mem::Block>_>::clear(&local_b8);
    pRVar2 = extraout_RDX_00;
  }
  PVar3.m_refCount = pRVar2;
  PVar3.m_p = (Block *)this;
  return PVar3;
}

Assistant:

rc::Ptr<mem::Block>
	createPackage_va(axl_va_list va) {
		size_t size = 0;
		pack_va(NULL, &size, va);

		if (size == -1)
			return rc::g_nullPtr;

		typedef rc::Box<mem::Block> Package;
		rc::Ptr<Package> package = AXL_RC_NEW_EXTRA(Package, size);
		pack_va(package + 1, &size, va);
		package->m_p = package + 1;
		package->m_size = size;

		return package;
	}